

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbsdf.c
# Opt level: O1

void compare_neighbor(ED *current,FT_Int x_offset,FT_Int y_offset,FT_Int width)

{
  FT_Fixed FVar1;
  int iVar2;
  FT_16D16_Vec dist_vec;
  FT_Vector local_18;
  
  iVar2 = width * y_offset;
  if (current[(long)iVar2 + (long)x_offset].dist + -0x10000 < current->dist) {
    local_18.x = current[(long)iVar2 + (long)x_offset].prox.x + (long)(x_offset << 0x10);
    local_18.y = current[(long)iVar2 + (long)x_offset].prox.y + (long)(y_offset << 0x10);
    FVar1 = FT_Vector_Length(&local_18);
    if ((int)FVar1 < current->dist) {
      current->dist = (int)FVar1;
      (current->prox).x = local_18.x;
      (current->prox).y = local_18.y;
    }
  }
  return;
}

Assistant:

static void
  compare_neighbor( ED*     current,
                    FT_Int  x_offset,
                    FT_Int  y_offset,
                    FT_Int  width )
  {
    ED*           to_check;
    FT_16D16      dist;
    FT_16D16_Vec  dist_vec;


    to_check = current + ( y_offset * width ) + x_offset;

    /*
     * While checking for the nearest point we first approximate the
     * distance of `current` by adding the deviation (which is sqrt(2) at
     * most).  Only if the new value is less than the current value we
     * calculate the actual distances using `FT_Vector_Length`.  This last
     * step can be omitted by using squared distances.
     */

    /*
     * Approximate the distance.  We subtract 1 to avoid precision errors,
     * which could happen because the two directions can be opposite.
     */
    dist = to_check->dist - ONE;

    if ( dist < current->dist )
    {
      dist_vec = to_check->prox;

      dist_vec.x += x_offset * ONE;
      dist_vec.y += y_offset * ONE;
      dist = VECTOR_LENGTH_16D16( dist_vec );

      if ( dist < current->dist )
      {
        current->dist = dist;
        current->prox = dist_vec;
      }
    }
  }